

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.h
# Opt level: O2

void __thiscall
WorkerContext::WorkerContext
          (WorkerContext *this,string *identity,DatabaseSnapshot *snap,TaskSpec *task)

{
  _Storage<Task,_false> local_40;
  undefined1 local_20;
  
  std::__cxx11::string::string((string *)this,(string *)identity);
  DatabaseSnapshot::DatabaseSnapshot(&this->snap,snap);
  (this->task).super__Optional_base<Task,_false,_false>._M_payload.
  super__Optional_payload<Task,_true,_false,_false>.super__Optional_payload_base<Task>._M_engaged =
       false;
  if (task != (TaskSpec *)0x0) {
    local_40._M_value.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_40._M_value.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40._M_value.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_20 = 1;
    local_40._M_value.spec_ = task;
    std::_Optional_payload_base<Task>::_M_move_assign
              ((_Optional_payload_base<Task> *)&this->task,
               (_Optional_payload_base<Task> *)&local_40._M_value);
    std::_Optional_payload_base<Task>::_M_reset((_Optional_payload_base<Task> *)&local_40._M_value);
  }
  return;
}

Assistant:

WorkerContext(std::string identity, DatabaseSnapshot &&snap, TaskSpec *task)
        : identity(identity), snap(std::move(snap)) {
        if (task != nullptr) {
            this->task = std::make_optional<Task>(task);
        }
    }